

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bssplitscb(bStream *s,const_bstring splitStr,_func_int_void_ptr_int_const_bstring *cb,void *parm
              )

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  bstring r;
  int iVar5;
  int iVar6;
  charField chrs;
  charField local_50;
  
  uVar4 = 0xffffffff;
  if ((((s != (bStream *)0x0 && cb != (_func_int_void_ptr_int_const_bstring *)0x0) &&
       (splitStr != (const_bstring)0x0)) && (s->readFnPtr != (bNread)0x0)) &&
     ((-1 < splitStr->slen && (r = bfromcstr(anon_var_dwarf_2ab63 + 0x10), r != (bstring)0x0)))) {
    if (splitStr->slen != 0) {
      buildCharField(&local_50,splitStr);
      iVar3 = r->slen;
      iVar6 = 0;
      iVar5 = 0;
      do {
        if (iVar3 <= iVar6) {
          bsreada(r,s,0x100);
          iVar3 = r->slen;
          if (iVar3 <= iVar6) goto LAB_001369d3;
        }
        bVar1 = r->data[iVar6];
        if ((local_50.content[bVar1 >> 3] >> (bVar1 & 7) & 1) != 0) {
          uVar4 = 0xffffffff;
          if (s->buff == (bstring)0x0) goto LAB_001369e8;
          iVar3 = binsertblk(s->buff,0,r->data + (long)iVar6 + 1,iVar3 - (iVar6 + 1),'?');
          if (iVar3 < 0) goto LAB_001369e8;
          r->slen = iVar6;
          uVar2 = r->data[iVar6];
          r->data[iVar6] = '\0';
          uVar4 = (*cb)(parm,iVar5,r);
          if ((int)uVar4 < 0) goto LAB_001369e8;
          r->data[iVar6] = uVar2;
          r->slen = 0;
          iVar5 = iVar5 + iVar6 + 1;
          iVar6 = -1;
          iVar3 = 0;
        }
        iVar6 = iVar6 + 1;
      } while( true );
    }
    do {
      iVar3 = bsreada(r,s,0x100);
    } while (-1 < iVar3);
    iVar5 = 0;
LAB_001369d3:
    uVar4 = (*cb)(parm,iVar5,r);
    uVar4 = (int)uVar4 >> 0x1f & uVar4;
LAB_001369e8:
    bdestroy(r);
  }
  return uVar4;
}

Assistant:

int bssplitscb (struct bStream * s, const_bstring splitStr,
	int (* cb) (void * parm, int ofs, const_bstring entry), void * parm) {
	struct charField chrs;
	bstring buff;
	int i = 0, p = 0, ret = 0;

	if (cb == NULL || s == NULL || s->readFnPtr == NULL ||
	    splitStr == NULL || splitStr->slen < 0) return BSTR_ERR;

	if (NULL == (buff = bfromcstr (""))) return BSTR_ERR;

	if (splitStr->slen == 0) {
		while (bsreada (buff, s, BSSSC_BUFF_LEN) >= 0) ;
		if ((ret = cb (parm, 0, buff)) > 0)
			ret = 0;
	} else {
		buildCharField (&chrs, splitStr);
		for (;;) {
			if (i >= buff->slen) {
				bsreada (buff, s, BSSSC_BUFF_LEN);
				if (i >= buff->slen) {
					if (0 < (ret = cb (parm, p, buff))) ret = 0;
					break;
				}
			}
			if (testInCharField (&chrs, buff->data[i])) {
				struct tagbstring t;
				unsigned char c;

				blk2tbstr (t, buff->data + i + 1, buff->slen - (i + 1));
				if ((ret = bsunread (s, &t)) < 0) break;
				buff->slen = i;
				c = buff->data[i];
				buff->data[i] = (unsigned char) '\0';
				if ((ret = cb (parm, p, buff)) < 0) break;
				buff->data[i] = c;
				buff->slen = 0;
				p += i + 1;
				i = -1;
			}
			i++;
		}
	}

	bdestroy (buff);
	return ret;
}